

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_550beb::SpecialName::printLeft(SpecialName *this,OutputStream *S)

{
  char *__src;
  Node *pNVar1;
  size_t N;
  
  __src = (this->Special).First;
  N = (long)(this->Special).Last - (long)__src;
  if (N != 0) {
    OutputStream::grow(S,N);
    memmove(S->Buffer + S->CurrentPosition,__src,N);
    S->CurrentPosition = S->CurrentPosition + N;
  }
  pNVar1 = this->Child;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Special;
    Child->print(S);
  }